

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void duckdb::ListUpdateFunction
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,
               Vector *state_vector,idx_t count)

{
  LinkedList *linked_list;
  FunctionData *pFVar1;
  ulong uVar2;
  UnifiedVectorFormat states_data;
  RecursiveUnifiedVectorFormat input_data;
  ulong local_f8;
  UnifiedVectorFormat local_f0;
  RecursiveUnifiedVectorFormat local_a8;
  
  RecursiveUnifiedVectorFormat::RecursiveUnifiedVectorFormat(&local_a8);
  Vector::RecursiveToUnifiedFormat(inputs,count,&local_a8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_f0);
  Vector::ToUnifiedFormat(state_vector,count,&local_f0);
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  for (local_f8 = 0; local_f8 < count; local_f8 = local_f8 + 1) {
    uVar2 = local_f8;
    if ((local_f0.sel)->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)(local_f0.sel)->sel_vector[local_f8];
    }
    linked_list = *(LinkedList **)(local_f0.data + uVar2 * 8);
    ArenaAllocator::AlignNext(aggr_input_data->allocator);
    ListSegmentFunctions::AppendRow
              ((ListSegmentFunctions *)(pFVar1 + 4),aggr_input_data->allocator,linked_list,&local_a8
               ,&local_f8);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_f0);
  RecursiveUnifiedVectorFormat::~RecursiveUnifiedVectorFormat(&local_a8);
  return;
}

Assistant:

static void ListUpdateFunction(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count,
                               Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);
	auto &input = inputs[0];
	RecursiveUnifiedVectorFormat input_data;
	Vector::RecursiveToUnifiedFormat(input, count, input_data);

	UnifiedVectorFormat states_data;
	state_vector.ToUnifiedFormat(count, states_data);
	auto states = UnifiedVectorFormat::GetData<ListAggState *>(states_data);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();

	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[states_data.sel->get_index(i)];
		aggr_input_data.allocator.AlignNext();
		list_bind_data.functions.AppendRow(aggr_input_data.allocator, state.linked_list, input_data, i);
	}
}